

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O1

int Tab_TabHashAdd(Tab_Tab_t *p,int *pLits,int Func,int Cost)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Tab_Obj_t *pTVar4;
  Tab_Obj_t *pTVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  size_t __size;
  int iVar9;
  ulong uVar10;
  
  lVar8 = (long)p->SizeMask + 1;
  if (p->nBins == (int)lVar8) {
    __size = lVar8 * 0x20;
    if (p->pBins == (Tab_Obj_t *)0x0) {
      pTVar4 = (Tab_Obj_t *)malloc(__size);
    }
    else {
      pTVar4 = (Tab_Obj_t *)realloc(p->pBins,__size);
    }
    p->pBins = pTVar4;
    iVar2 = p->SizeMask;
    lVar8 = (long)iVar2;
    memset(pTVar4 + lVar8 + 1,0,lVar8 * 0x10 + 0x10);
    if (pTVar4 < pTVar4 + lVar8 + 1) {
      pTVar5 = pTVar4 + -1;
      do {
        pTVar5[1].Table = 0;
        pTVar5[1].Next = 0;
        pTVar5 = pTVar5 + 1;
      } while (pTVar5 < pTVar4 + lVar8);
    }
    uVar3 = iVar2 * 2 + 1;
    p->SizeMask = uVar3;
    uVar10 = 0x10;
    while ((Tab_Obj_t *)((long)&pTVar4[-1].Table + uVar10) < pTVar4 + lVar8) {
      uVar7 = (uint)(*(ulong *)(&pTVar4->field_0x8 + uVar10) >> 0x20);
      uVar7 = (uVar7 >> 0x1e) * 0x18000005 +
              ((uint)(*(ulong *)(&pTVar4->field_0x8 + uVar10) >> 0x11) & 0x7fff) * 0x3000005 +
              (uVar7 & 0x7fff) * 0x6000017 + (uVar7 >> 0xf & 0x7fff) * 0xc000013 & uVar3;
      iVar2 = pTVar4[uVar7].Table;
      *(int *)((long)&pTVar4->Next + uVar10) = iVar2;
      iVar9 = (int)(uVar10 >> 4);
      pTVar4[uVar7].Table = iVar9;
      uVar10 = uVar10 + 0x10;
      if (iVar2 == iVar9 && iVar2 != 0) {
        __assert_fail("!pEnt->Next || pEnt->Next != pBin->Table",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                      ,0x7f,"void Tab_TabRehash(Tab_Tab_t *)");
      }
    }
  }
  iVar2 = p->nBins;
  if (iVar2 <= p->SizeMask) {
    pTVar4 = p->pBins;
    uVar3 = *pLits;
    uVar7 = Func * 0x18000005 + uVar3 * 0x3000005 + pLits[2] * 0xc000013 + pLits[1] * 0x6000017 &
            p->SizeMask;
    iVar9 = pTVar4[(int)uVar7].Table;
    if (pTVar4 != (Tab_Obj_t *)0x0 && (long)iVar9 != 0) {
      pTVar5 = pTVar4 + iVar9;
      do {
        uVar10 = *(ulong *)&pTVar5->field_0x8;
        if (((((uint)(uVar10 >> 0x11) & 0x7fff) == uVar3) &&
            (uVar6 = (uint)(uVar10 >> 0x20), (uVar6 & 0x7fff) == pLits[1])) &&
           (uVar6 >> 0x1e == Func && (uVar6 >> 0xf & 0x7fff) == pLits[2])) {
          *(ulong *)&pTVar5->field_0x8 =
               uVar10 & 0xfffffffffffe0000 | (ulong)(Cost + (int)uVar10 & 0x1ffff);
          return iVar2;
        }
        piVar1 = &pTVar5->Next;
        pTVar5 = pTVar4 + *piVar1;
        if ((long)*piVar1 == 0) {
          pTVar5 = (Tab_Obj_t *)0x0;
        }
      } while (pTVar5 != (Tab_Obj_t *)0x0);
    }
    uVar3 = uVar3 << 0x11;
    uVar10 = *(ulong *)&pTVar4[iVar2].field_0x8;
    *(ulong *)&pTVar4[iVar2].field_0x8 = uVar10 & 0xffffffff0001ffff | (ulong)uVar3;
    uVar6 = pLits[1];
    *(ulong *)&pTVar4[iVar2].field_0x8 =
         uVar10 & 0xffff80000001ffff | (ulong)uVar3 | (ulong)(uVar6 & 0x7fff) << 0x20;
    *(ulong *)&pTVar4[iVar2].field_0x8 =
         (ulong)(Cost & 0x1ffff) |
         (ulong)(uint)Func << 0x3e |
         CONCAT44(uVar6,uVar3) & 0x7fffffffffff | (ulong)(pLits[2] & 0x7fff) << 0x2f;
    pTVar4[iVar2].Next = iVar9;
    iVar2 = p->nBins;
    p->nBins = iVar2 + 1;
    pTVar4[(int)uVar7].Table = iVar2;
    if (iVar9 != iVar2 || iVar9 == 0) {
      return CONCAT31((int3)((uint)iVar2 >> 8),iVar9 == iVar2 && iVar9 != 0);
    }
    __assert_fail("!pEnt->Next || pEnt->Next != pBin->Table",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                  ,0x95,"int Tab_TabHashAdd(Tab_Tab_t *, int *, int, int)");
  }
  __assert_fail("p->nBins < p->SizeMask + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                ,0x87,"int Tab_TabHashAdd(Tab_Tab_t *, int *, int, int)");
}

Assistant:

static inline int         Tab_TabHashAdd( Tab_Tab_t * p, int * pLits, int Func, int Cost )
{
    if ( p->nBins == p->SizeMask + 1 )
        Tab_TabRehash( p );
    assert( p->nBins < p->SizeMask + 1 );
    {
        Tab_Obj_t * pEnt, * pBin = p->pBins + Tab_Hash(pLits[0], pLits[1], pLits[2], Func, p->SizeMask);
        for ( pEnt = Tab_TabEntry(p, pBin->Table); pEnt; pEnt = Tab_TabEntry(p, pEnt->Next) )
            if ( (int)pEnt->LitA == pLits[0] && (int)pEnt->LitB == pLits[1] && (int)pEnt->LitC == pLits[2] && (int)pEnt->Func == Func )
                {  pEnt->Cost += Cost; return 1; }
        pEnt = p->pBins + p->nBins;
        pEnt->LitA  = pLits[0];
        pEnt->LitB  = pLits[1];
        pEnt->LitC  = pLits[2];
        pEnt->Func  = Func;
        pEnt->Cost  = Cost;
        pEnt->Next  = pBin->Table;
        pBin->Table = p->nBins++;
        assert( !pEnt->Next || pEnt->Next != pBin->Table );
        return 0;
    }
}